

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

StructUnionMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::StructUnionMemberSyntax,slang::syntax::StructUnionMemberSyntax_const&>
          (BumpAllocator *this,StructUnionMemberSyntax *args)

{
  StructUnionMemberSyntax *this_00;
  
  this_00 = (StructUnionMemberSyntax *)allocate(this,0xb0,8);
  slang::syntax::StructUnionMemberSyntax::StructUnionMemberSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }